

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall t_go_generator::generate_service_server(t_go_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  ostream *poVar4;
  pointer pptVar5;
  string *this_00;
  string escapedFuncName;
  string local_1b0;
  string self;
  string serviceName;
  string pServiceName;
  string local_128;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string extends_processor;
  string extends_processor_new;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&extends_processor);
  std::__cxx11::string::string((string *)&extends_processor,"",(allocator *)&extends_processor_new);
  std::__cxx11::string::string((string *)&extends_processor_new,"",(allocator *)&serviceName);
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  publicize(&serviceName,this,(string *)CONCAT44(extraout_var,iVar2),false);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&pServiceName,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&extends,(string *)&pServiceName);
    std::__cxx11::string::~string((string *)&pServiceName);
    lVar3 = std::__cxx11::string::rfind((char *)&extends,0x2fd4e8);
    if (lVar3 == -1) {
      publicize(&self,this,&extends,false);
      std::operator+(&pServiceName,&self,"Processor");
      std::__cxx11::string::operator=((string *)&extends_processor,(string *)&pServiceName);
      std::__cxx11::string::~string((string *)&pServiceName);
      std::__cxx11::string::~string((string *)&self);
      std::operator+(&pServiceName,"New",&extends_processor);
      this_00 = &pServiceName;
      std::__cxx11::string::operator=((string *)&extends_processor_new,(string *)this_00);
    }
    else {
      std::__cxx11::string::substr((ulong)&escapedFuncName,(ulong)&extends);
      std::__cxx11::string::substr((ulong)&local_128,(ulong)&extends);
      publicize(&local_1b0,this,&local_128,false);
      std::operator+(&self,&escapedFuncName,&local_1b0);
      std::operator+(&pServiceName,&self,"Processor");
      std::__cxx11::string::operator=((string *)&extends_processor,(string *)&pServiceName);
      std::__cxx11::string::~string((string *)&pServiceName);
      std::__cxx11::string::~string((string *)&self);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&escapedFuncName);
      std::__cxx11::string::substr((ulong)&local_1b0,(ulong)&extends);
      std::operator+(&escapedFuncName,&local_1b0,"New");
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&extends);
      publicize(&local_128,this,&local_50,false);
      std::operator+(&self,&escapedFuncName,&local_128);
      std::operator+(&pServiceName,&self,"Processor");
      std::__cxx11::string::operator=((string *)&extends_processor_new,(string *)&pServiceName);
      std::__cxx11::string::~string((string *)&pServiceName);
      std::__cxx11::string::~string((string *)&self);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&escapedFuncName);
      this_00 = &local_1b0;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  privatize(&pServiceName,this,(string *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::string::string((string *)&local_70,"self",(allocator *)&escapedFuncName);
  t_generator::tmp(&self,&this->super_t_generator,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = &this->f_types_;
  if (extends_processor._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"type ");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor struct {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  processorMap map[string]thrift.TProcessorFunction");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  handler ");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"func (p *");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,
                             "Processor) AddToProcessorMap(key string, processor thrift.TProcessorFunction) {"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  p.processorMap[key] = processor");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"func (p *");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,
                             "Processor) GetProcessorFunction(key string) (processor thrift.TProcessorFunction, ok bool) {"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  processor, ok = p.processorMap[key]");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  return processor, ok");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"func (p *");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,
                             "Processor) ProcessorMap() map[string]thrift.TProcessorFunction {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  return p.processorMap");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"func New");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor(handler ");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,") *");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor {");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&self);
    poVar4 = std::operator<<(poVar4," := &");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,
                             "Processor{handler:handler, processorMap:make(map[string]thrift.TProcessorFunction)}"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    for (pptVar5 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        pptVar5 !=
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[3])(&escapedFuncName,this,&(*pptVar5)->name_);
      t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = std::operator<<(poVar4,(string *)&self);
      poVar4 = std::operator<<(poVar4,".processorMap[\"");
      poVar4 = std::operator<<(poVar4,(string *)&escapedFuncName);
      poVar4 = std::operator<<(poVar4,"\"] = &");
      poVar4 = std::operator<<(poVar4,(string *)&pServiceName);
      poVar4 = std::operator<<(poVar4,"Processor");
      publicize(&local_128,this,&(*pptVar5)->name_,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_128);
      poVar4 = std::operator<<(poVar4,"{handler:handler}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&escapedFuncName);
    }
    std::__cxx11::string::string((string *)&local_90,"x",(allocator *)&local_1b0);
    t_generator::tmp(&escapedFuncName,&this->super_t_generator,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"return ");
    poVar4 = std::operator<<(poVar4,(string *)&self);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"func (p *");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,
                             "Processor) Process(ctx context.Context, iprot, oprot thrift.TProtocol) (success bool, err thrift.TException) {"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  name, _, seqId, err2 := iprot.ReadMessageBegin(ctx)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  if err2 != nil { return false, thrift.WrapTException(err2) }"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  if processor, ok := p.GetProcessorFunction(name); ok {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"    return processor.Process(ctx, seqId, iprot, oprot)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  }");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  iprot.Skip(ctx, thrift.STRUCT)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  iprot.ReadMessageEnd(ctx)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,
                             " := thrift.NewTApplicationException(thrift.UNKNOWN_METHOD, \"Unknown function \" + name)"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  oprot.WriteMessageBegin(ctx, name, thrift.EXCEPTION, seqId)")
    ;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,".Write(ctx, oprot)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  oprot.WriteMessageEnd(ctx)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  oprot.Flush(ctx)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"  return false, ");
    poVar4 = std::operator<<(poVar4,(string *)&escapedFuncName);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  else {
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"type ");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor struct {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  *");
    poVar4 = std::operator<<(poVar4,(string *)&extends_processor);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"func New");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor(handler ");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,") *");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&self);
    poVar4 = std::operator<<(poVar4," := &");
    poVar4 = std::operator<<(poVar4,(string *)&serviceName);
    poVar4 = std::operator<<(poVar4,"Processor{");
    poVar4 = std::operator<<(poVar4,(string *)&extends_processor_new);
    poVar4 = std::operator<<(poVar4,"(handler)}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    for (pptVar5 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        pptVar5 !=
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[3])(&escapedFuncName,this,&(*pptVar5)->name_);
      t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
      poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = std::operator<<(poVar4,(string *)&self);
      poVar4 = std::operator<<(poVar4,".AddToProcessorMap(\"");
      poVar4 = std::operator<<(poVar4,(string *)&escapedFuncName);
      poVar4 = std::operator<<(poVar4,"\", &");
      poVar4 = std::operator<<(poVar4,(string *)&pServiceName);
      poVar4 = std::operator<<(poVar4,"Processor");
      publicize(&local_128,this,&(*pptVar5)->name_,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_128);
      poVar4 = std::operator<<(poVar4,"{handler:handler})");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&escapedFuncName);
    }
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"  return ");
    poVar4 = std::operator<<(poVar4,(string *)&self);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&escapedFuncName);
    t_generator::indent_abi_cxx11_(&escapedFuncName,&this->super_t_generator);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&escapedFuncName);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&escapedFuncName);
  for (pptVar5 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    generate_process_function(this,tservice,*pptVar5);
  }
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&self);
  std::__cxx11::string::~string((string *)&pServiceName);
  std::__cxx11::string::~string((string *)&serviceName);
  std::__cxx11::string::~string((string *)&extends_processor_new);
  std::__cxx11::string::~string((string *)&extends_processor);
  std::__cxx11::string::~string((string *)&extends);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_go_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  string extends = "";
  string extends_processor = "";
  string extends_processor_new = "";
  string serviceName(publicize(tservice->get_name()));

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    size_t index = extends.rfind(".");

    if (index != string::npos) {
      extends_processor = extends.substr(0, index + 1) + publicize(extends.substr(index + 1))
                          + "Processor";
      extends_processor_new = extends.substr(0, index + 1) + "New"
                              + publicize(extends.substr(index + 1)) + "Processor";
    } else {
      extends_processor = publicize(extends) + "Processor";
      extends_processor_new = "New" + extends_processor;
    }
  }

  string pServiceName(privatize(tservice->get_name()));
  // Generate the header portion
  string self(tmp("self"));

  if (extends_processor.empty()) {
    f_types_ << indent() << "type " << serviceName << "Processor struct {" << endl;
    f_types_ << indent() << "  processorMap map[string]thrift.TProcessorFunction" << endl;
    f_types_ << indent() << "  handler " << serviceName << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) AddToProcessorMap(key string, processor thrift.TProcessorFunction) {"
               << endl;
    f_types_ << indent() << "  p.processorMap[key] = processor" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) GetProcessorFunction(key string) "
                  "(processor thrift.TProcessorFunction, ok bool) {" << endl;
    f_types_ << indent() << "  processor, ok = p.processorMap[key]" << endl;
    f_types_ << indent() << "  return processor, ok" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) ProcessorMap() map[string]thrift.TProcessorFunction {" << endl;
    f_types_ << indent() << "  return p.processorMap" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func New" << serviceName << "Processor(handler " << serviceName
               << ") *" << serviceName << "Processor {" << endl << endl;
    f_types_
        << indent() << "  " << self << " := &" << serviceName
        << "Processor{handler:handler, processorMap:make(map[string]thrift.TProcessorFunction)}"
        << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      string escapedFuncName(escape_string((*f_iter)->get_name()));
      f_types_ << indent() << "  " << self << ".processorMap[\"" << escapedFuncName << "\"] = &"
                 << pServiceName << "Processor" << publicize((*f_iter)->get_name())
                 << "{handler:handler}" << endl;
    }

    string x(tmp("x"));
    f_types_ << indent() << "return " << self << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) Process(ctx context.Context, iprot, oprot thrift.TProtocol) (success bool, err "
                  "thrift.TException) {" << endl;
    f_types_ << indent() << "  name, _, seqId, err2 := iprot.ReadMessageBegin(ctx)" << endl;
    f_types_ << indent() << "  if err2 != nil { return false, thrift.WrapTException(err2) }" << endl;
    f_types_ << indent() << "  if processor, ok := p.GetProcessorFunction(name); ok {" << endl;
    f_types_ << indent() << "    return processor.Process(ctx, seqId, iprot, oprot)" << endl;
    f_types_ << indent() << "  }" << endl;
    f_types_ << indent() << "  iprot.Skip(ctx, thrift.STRUCT)" << endl;
    f_types_ << indent() << "  iprot.ReadMessageEnd(ctx)" << endl;
    f_types_ << indent() << "  " << x
               << " := thrift.NewTApplicationException(thrift.UNKNOWN_METHOD, \"Unknown function "
                  "\" + name)" << endl;
    f_types_ << indent() << "  oprot.WriteMessageBegin(ctx, name, thrift.EXCEPTION, seqId)" << endl;
    f_types_ << indent() << "  " << x << ".Write(ctx, oprot)" << endl;
    f_types_ << indent() << "  oprot.WriteMessageEnd(ctx)" << endl;
    f_types_ << indent() << "  oprot.Flush(ctx)" << endl;
    f_types_ << indent() << "  return false, " << x << endl;
    f_types_ << indent() << "" << endl;
    f_types_ << indent() << "}" << endl << endl;
  } else {
    f_types_ << indent() << "type " << serviceName << "Processor struct {" << endl;
    f_types_ << indent() << "  *" << extends_processor << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func New" << serviceName << "Processor(handler " << serviceName
               << ") *" << serviceName << "Processor {" << endl;
    f_types_ << indent() << "  " << self << " := &" << serviceName << "Processor{"
               << extends_processor_new << "(handler)}" << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      string escapedFuncName(escape_string((*f_iter)->get_name()));
      f_types_ << indent() << "  " << self << ".AddToProcessorMap(\"" << escapedFuncName
                 << "\", &" << pServiceName << "Processor" << publicize((*f_iter)->get_name())
                 << "{handler:handler})" << endl;
    }

    f_types_ << indent() << "  return " << self << endl;
    f_types_ << indent() << "}" << endl << endl;
  }

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }

  f_types_ << endl;
}